

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int modify_field(void *basep,field_s *field,char *data)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *dest;
  int nchars;
  int fc;
  int max;
  int val;
  char *posn;
  char *pcStack_28;
  float fval;
  char *data_local;
  field_s *field_local;
  void *basep_local;
  
  _max = data;
  pcStack_28 = data;
  data_local = (char *)field;
  field_local = (field_s *)basep;
  if (1 < g_debug) {
    fprintf(_stderr,"+d modifying field \'%s\' with \'%s\'\n",field->name,data);
  }
  if ((pcStack_28 == (char *)0x0) || (sVar3 = strlen(pcStack_28), sVar3 == 0)) {
    fprintf(_stderr,"** no data for \'%s\' field modification\n",data_local + 0x10);
    return 1;
  }
  iVar2 = *(int *)data_local;
  if (iVar2 == -0xfff) {
    iVar2 = *(int *)(data_local + 4);
    pcVar1 = field_local->name;
    sVar3 = strlen(pcStack_28);
    dest._0_4_ = (int)sVar3;
    strncpy(pcVar1 + (long)iVar2 + -0x10,pcStack_28,(long)*(int *)(data_local + 0xc));
    if ((int)dest < *(int *)(data_local + 0xc)) {
      memset(pcVar1 + (long)iVar2 + -0x10 + (int)dest,0,
             (long)(*(int *)(data_local + 0xc) - (int)dest));
    }
  }
  else {
    if ((iVar2 + 0xfefU < 3) || (iVar2 == 0)) {
LAB_00110cf1:
      fprintf(_stderr,"** refusing to modify a pointer field, \'%s\'\n",data_local + 0x10);
      return 1;
    }
    if (iVar2 == 4) {
      nchars = 0x7fff;
      for (dest._4_4_ = 0; (int)dest._4_4_ < *(int *)(data_local + 0xc); dest._4_4_ = dest._4_4_ + 1
          ) {
        iVar2 = __isoc99_sscanf(_max," %d%n",&fc);
        if (iVar2 != 1) {
          fprintf(_stderr,"** found %d of %d modify values\n",(ulong)dest._4_4_,
                  (ulong)*(uint *)(data_local + 0xc));
          return 1;
        }
        if ((nchars < fc) || (SBORROW4(fc,-(nchars + 1)) != fc + nchars + 1 < 0)) {
          fprintf(_stderr,"** mod val #%d (= %d) outside byte range [-%d,%d]\n",(ulong)dest._4_4_,
                  (ulong)(uint)fc,(ulong)(nchars + 1),(ulong)(uint)nchars);
          return 1;
        }
        *(short *)(field_local->name +
                  (long)(int)dest._4_4_ * 2 + (long)*(int *)(data_local + 4) + -0x10) = (short)fc;
        if (1 < g_debug) {
          fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",(ulong)dest._4_4_,data_local + 0x10
                  ,(ulong)(uint)fc);
        }
        _max = _max + (int)dest;
      }
    }
    else if (iVar2 == 8) {
      for (dest._4_4_ = 0; (int)dest._4_4_ < *(int *)(data_local + 0xc); dest._4_4_ = dest._4_4_ + 1
          ) {
        iVar2 = __isoc99_sscanf(_max," %d%n",&fc,&dest);
        if (iVar2 != 1) {
          fprintf(_stderr,"** found %d of %d modify values\n",(ulong)dest._4_4_,
                  (ulong)*(uint *)(data_local + 0xc));
          return 1;
        }
        *(int *)(field_local->name +
                (long)(int)dest._4_4_ * 4 + (long)*(int *)(data_local + 4) + -0x10) = fc;
        if (1 < g_debug) {
          fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",(ulong)dest._4_4_,data_local + 0x10
                  ,(ulong)(uint)fc);
        }
        _max = _max + (int)dest;
      }
    }
    else if (iVar2 == 0x10) {
      for (dest._4_4_ = 0; (int)dest._4_4_ < *(int *)(data_local + 0xc); dest._4_4_ = dest._4_4_ + 1
          ) {
        iVar2 = __isoc99_sscanf(_max," %f%n",(long)&posn + 4,&dest);
        if (iVar2 != 1) {
          fprintf(_stderr,"** found %d of %d modify values\n",(ulong)dest._4_4_,
                  (ulong)*(uint *)(data_local + 0xc));
          return 1;
        }
        *(float *)(field_local->name +
                  (long)(int)dest._4_4_ * 4 + (long)*(int *)(data_local + 4) + -0x10) = posn._4_4_;
        if (1 < g_debug) {
          fprintf(_stderr,"+d setting posn %d of \'%s\' to %f\n",(double)posn._4_4_,
                  (ulong)dest._4_4_,data_local + 0x10);
        }
        _max = _max + (int)dest;
      }
    }
    else {
      if (iVar2 != 0x100) goto LAB_00110cf1;
      nchars = 0x7f;
      for (dest._4_4_ = 0; (int)dest._4_4_ < *(int *)(data_local + 0xc); dest._4_4_ = dest._4_4_ + 1
          ) {
        iVar2 = __isoc99_sscanf(_max," %d%n",&fc);
        if (iVar2 != 1) {
          fprintf(_stderr,"** found %d of %d modify values\n",(ulong)dest._4_4_,
                  (ulong)*(uint *)(data_local + 0xc));
          return 1;
        }
        if ((nchars < fc) || (SBORROW4(fc,-(nchars + 1)) != fc + nchars + 1 < 0)) {
          fprintf(_stderr,"** mod val #%d (= %d) outside byte range [-%d,%d]\n",(ulong)dest._4_4_,
                  (ulong)(uint)fc,(ulong)(nchars + 1),(ulong)(uint)nchars);
          return 1;
        }
        field_local->name[(long)(int)dest._4_4_ + (long)*(int *)(data_local + 4) + -0x10] = (char)fc
        ;
        if (1 < g_debug) {
          fprintf(_stderr,"+d setting posn %d of \'%s\' to %d\n",(ulong)dest._4_4_,data_local + 0x10
                  ,(ulong)(uint)fc);
        }
        _max = _max + (int)dest;
      }
    }
  }
  return 0;
}

Assistant:

int modify_field(void * basep, field_s * field, char * data)
{
   float   fval;
   char  * posn = data;
   int     val, max, fc, nchars;

   if( g_debug > 1 )
      fprintf(stderr,"+d modifying field '%s' with '%s'\n", field->name, data);

   if( !data || strlen(data) == 0 )
   {
      fprintf(stderr,"** no data for '%s' field modification\n",field->name);
      return 1;
   }

   switch( field->type )
   {
         case DT_UNKNOWN:
         case NT_DT_POINTER:
         case NT_DT_CHAR_PTR:
         case NT_DT_EXT_PTR:
         default:
            fprintf(stderr,"** refusing to modify a pointer field, '%s'\n",
                    field->name);
            return 1;

         case DT_INT8:
         {
            max = 127;
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               if( val > max || val < -(max+1) )
               {
                  fprintf(stderr,
                    "** mod val #%d (= %d) outside byte range [-%d,%d]\n",
                    fc, val, max+1, max);
                  return 1;
               }
               /* otherwise, we're good */
               (((char *)basep + field->offset))[fc] = (char)val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_INT16:
         {
            max = 32767;
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               if( val > max || val < -(max+1) )
               {
                  fprintf(stderr,
                    "** mod val #%d (= %d) outside byte range [-%d,%d]\n",
                    fc, val, max+1, max);
                  return 1;
               }
               /* otherwise, we're good */
               ((short *)((char *)basep + field->offset))[fc] = (short)val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_INT32:
         {
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %d%n", &val, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               ((int *)((char *)basep + field->offset))[fc] = val;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %d\n",
                          fc, field->name, val);
               posn += nchars;
            }
         }
         break;

         case DT_FLOAT32:
         {
            for( fc = 0; fc < field->len; fc++ )
            {
               if( sscanf(posn, " %f%n", &fval, &nchars) != 1 )
               {
                  fprintf(stderr,"** found %d of %d modify values\n",
                          fc,field->len);
                  return 1;
               }
               /* otherwise, we're good */
               ((float *)((char *)basep + field->offset))[fc] = fval;
               if( g_debug > 1 )
                  fprintf(stderr,"+d setting posn %d of '%s' to %f\n",
                          fc, field->name, fval);
               posn += nchars;
            }
         }
         break;

         case NT_DT_STRING:
         {
            char * dest = (char *)basep + field->offset;
            nchars = strlen(data);
            strncpy(dest, data, field->len);
            if( nchars < field->len )  /* clear the rest */
               memset(dest+nchars, '\0', field->len-nchars);
         }
         break;
   }

   return 0;
}